

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O3

void __thiscall RtApiPulse::callbackEvent(RtApiPulse *this)

{
  ostringstream *poVar1;
  StreamMutex *pSVar2;
  bool bVar3;
  uint uVar4;
  undefined8 *puVar5;
  code *pcVar6;
  char *inBuffer;
  StreamState SVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  char *pcVar13;
  size_t sVar14;
  ostream *poVar15;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  int pa_error;
  undefined4 local_5c;
  char *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  puVar5 = (undefined8 *)(this->super_RtApi).stream_.apiHandle;
  SVar7 = (this->super_RtApi).stream_.state;
  if (SVar7 == STREAM_STOPPED) {
    pSVar2 = &(this->super_RtApi).stream_.mutex;
    pthread_mutex_lock((pthread_mutex_t *)pSVar2);
    if (*(char *)(puVar5 + 9) == '\0') {
      do {
        pthread_cond_wait((pthread_cond_t *)(puVar5 + 3),(pthread_mutex_t *)pSVar2);
      } while (*(char *)(puVar5 + 9) != '\x01');
    }
    SVar7 = (this->super_RtApi).stream_.state;
    pthread_mutex_unlock((pthread_mutex_t *)pSVar2);
    if (SVar7 != STREAM_RUNNING) {
      return;
    }
    SVar7 = (this->super_RtApi).stream_.state;
  }
  if (SVar7 == STREAM_CLOSED) {
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_RtApi).errorText_,0,
               (char *)(this->super_RtApi).errorText_._M_string_length,0x1165fd);
    RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
    return;
  }
  pcVar6 = (code *)(this->super_RtApi).stream_.callbackInfo.callback;
  (*(this->super_RtApi)._vptr_RtApi[9])(this);
  iVar8 = (*pcVar6)((this->super_RtApi).stream_.userBuffer[0],
                    (this->super_RtApi).stream_.userBuffer[1],(this->super_RtApi).stream_.bufferSize
                    ,0,(this->super_RtApi).stream_.callbackInfo.userData);
  if (iVar8 != 2) {
    pSVar2 = &(this->super_RtApi).stream_.mutex;
    pthread_mutex_lock((pthread_mutex_t *)pSVar2);
    pcVar13 = (this->super_RtApi).stream_.deviceBuffer;
    pcVar18 = pcVar13;
    if ((this->super_RtApi).stream_.doConvertBuffer[1] == false) {
      pcVar18 = (this->super_RtApi).stream_.userBuffer[1];
    }
    bVar3 = (this->super_RtApi).stream_.doConvertBuffer[0];
    inBuffer = (this->super_RtApi).stream_.userBuffer[0];
    pcVar17 = inBuffer;
    if (bVar3 != false) {
      pcVar17 = pcVar13;
    }
    if ((this->super_RtApi).stream_.state == STREAM_RUNNING) {
      if (((this->super_RtApi).stream_.mode & ~DUPLEX) == OUTPUT) {
        local_58 = pcVar18;
        if (bVar3 == false) {
          lVar12 = 600;
          lVar16 = 0x22c;
        }
        else {
          RtApi::convertBuffer
                    (&this->super_RtApi,pcVar13,inBuffer,(this->super_RtApi).stream_.convertInfo);
          lVar12 = 0x260;
          lVar16 = 0x234;
        }
        uVar4 = (this->super_RtApi).stream_.bufferSize;
        iVar10 = *(int *)((long)&(this->super_RtApi)._vptr_RtApi + lVar16);
        uVar9 = RtApi::formatBytes(&this->super_RtApi,
                                   *(RtAudioFormat *)
                                    ((long)&(this->super_RtApi)._vptr_RtApi + lVar12));
        iVar10 = pa_simple_write(*puVar5,pcVar17,uVar4 * iVar10 * uVar9,&local_5c);
        pcVar18 = local_58;
        if (iVar10 < 0) {
          poVar1 = &(this->super_RtApi).errorStream_;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"RtApiPulse::callbackEvent: audio write error, ",0x2e);
          pcVar13 = (char *)pa_strerror(local_5c);
          if (pcVar13 == (char *)0x0) {
            std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
          }
          else {
            sVar14 = strlen(pcVar13);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar13,sVar14);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=
                    ((string *)&(this->super_RtApi).errorText_,(string *)local_50);
          pcVar18 = local_58;
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
          RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
        }
      }
      if ((uint)((this->super_RtApi).stream_.mode + ~OUTPUT) < 2) {
        bVar3 = (this->super_RtApi).stream_.doConvertBuffer[1];
        uVar4 = (this->super_RtApi).stream_.bufferSize;
        uVar9 = (this->super_RtApi).stream_.nUserChannels[(ulong)bVar3 * 2 + 1];
        uVar11 = RtApi::formatBytes(&this->super_RtApi,
                                    (this->super_RtApi).stream_.deviceFormat[(ulong)bVar3 * 2 + -1])
        ;
        iVar10 = pa_simple_read(puVar5[1],pcVar18,uVar4 * uVar9 * uVar11,&local_5c);
        if (iVar10 < 0) {
          poVar1 = &(this->super_RtApi).errorStream_;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"RtApiPulse::callbackEvent: audio read error, ",0x2d);
          pcVar13 = (char *)pa_strerror(local_5c);
          poVar15 = std::operator<<((ostream *)poVar1,pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,".",1);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=
                    ((string *)&(this->super_RtApi).errorText_,(string *)local_50);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
          RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
        }
        if ((this->super_RtApi).stream_.doConvertBuffer[1] == true) {
          RtApi::convertBuffer
                    (&this->super_RtApi,(this->super_RtApi).stream_.userBuffer[1],
                     (this->super_RtApi).stream_.deviceBuffer,
                     (this->super_RtApi).stream_.convertInfo + 1);
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)pSVar2);
    (this->super_RtApi).stream_.streamTime =
         (double)(this->super_RtApi).stream_.bufferSize /
         (double)(this->super_RtApi).stream_.sampleRate + (this->super_RtApi).stream_.streamTime;
    if (iVar8 == 1) {
      (*(this->super_RtApi)._vptr_RtApi[7])(this);
    }
    return;
  }
  (*(this->super_RtApi)._vptr_RtApi[8])(this);
  return;
}

Assistant:

void RtApiPulse::callbackEvent( void )
{
  PulseAudioHandle *pah = static_cast<PulseAudioHandle *>( stream_.apiHandle );

  if ( stream_.state == STREAM_STOPPED ) {
    MUTEX_LOCK( &stream_.mutex );
    while ( !pah->runnable )
      pthread_cond_wait( &pah->runnable_cv, &stream_.mutex );

    if ( stream_.state != STREAM_RUNNING ) {
      MUTEX_UNLOCK( &stream_.mutex );
      return;
    }
    MUTEX_UNLOCK( &stream_.mutex );
  }

  if ( stream_.state == STREAM_CLOSED ) {
    errorText_ = "RtApiPulse::callbackEvent(): the stream is closed ... "
      "this shouldn't happen!";
    error( RTAUDIO_WARNING );
    return;
  }

  RtAudioCallback callback = (RtAudioCallback) stream_.callbackInfo.callback;
  double streamTime = getStreamTime();
  RtAudioStreamStatus status = 0;
  int doStopStream = callback( stream_.userBuffer[OUTPUT], stream_.userBuffer[INPUT],
                               stream_.bufferSize, streamTime, status,
                               stream_.callbackInfo.userData );

  if ( doStopStream == 2 ) {
    abortStream();
    return;
  }

  MUTEX_LOCK( &stream_.mutex );
  void *pulse_in = stream_.doConvertBuffer[INPUT] ? stream_.deviceBuffer : stream_.userBuffer[INPUT];
  void *pulse_out = stream_.doConvertBuffer[OUTPUT] ? stream_.deviceBuffer : stream_.userBuffer[OUTPUT];

  if ( stream_.state != STREAM_RUNNING )
    goto unlock;

  int pa_error;
  size_t bytes;
  if ( stream_.mode == OUTPUT || stream_.mode == DUPLEX ) {
    if ( stream_.doConvertBuffer[OUTPUT] ) {
        convertBuffer( stream_.deviceBuffer,
                       stream_.userBuffer[OUTPUT],
                       stream_.convertInfo[OUTPUT] );
        bytes = stream_.nDeviceChannels[OUTPUT] * stream_.bufferSize *
                formatBytes( stream_.deviceFormat[OUTPUT] );
    } else
        bytes = stream_.nUserChannels[OUTPUT] * stream_.bufferSize *
                formatBytes( stream_.userFormat );

    if ( pa_simple_write( pah->s_play, pulse_out, bytes, &pa_error ) < 0 ) {
      errorStream_ << "RtApiPulse::callbackEvent: audio write error, " <<
        pa_strerror( pa_error ) << ".";
      errorText_ = errorStream_.str();
      error( RTAUDIO_WARNING );
    }
  }

  if ( stream_.mode == INPUT || stream_.mode == DUPLEX) {
    if ( stream_.doConvertBuffer[INPUT] )
      bytes = stream_.nDeviceChannels[INPUT] * stream_.bufferSize *
        formatBytes( stream_.deviceFormat[INPUT] );
    else
      bytes = stream_.nUserChannels[INPUT] * stream_.bufferSize *
        formatBytes( stream_.userFormat );
            
    if ( pa_simple_read( pah->s_rec, pulse_in, bytes, &pa_error ) < 0 ) {
      errorStream_ << "RtApiPulse::callbackEvent: audio read error, " <<
        pa_strerror( pa_error ) << ".";
      errorText_ = errorStream_.str();
      error( RTAUDIO_WARNING );
    }
    if ( stream_.doConvertBuffer[INPUT] ) {
      convertBuffer( stream_.userBuffer[INPUT],
                     stream_.deviceBuffer,
                     stream_.convertInfo[INPUT] );
    }
  }

 unlock:
  MUTEX_UNLOCK( &stream_.mutex );
  RtApi::tickStreamTime();

  if ( doStopStream == 1 )
    stopStream();
}